

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void convolve_maxpool_padding_zero
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int cstep,
               int filter_width_half,int filter_height_half)

{
  int iVar1;
  int iVar2;
  float local_78;
  int local_74;
  int local_6c;
  float a;
  int jj;
  int m;
  int ii;
  int l;
  int off;
  int k;
  float sum;
  int ww;
  int hh;
  int v;
  int w;
  int u;
  int h;
  int i;
  float **output_local;
  CNN_LAYER_CONFIG *layer_config_local;
  int in_stride_local;
  int in_height_local;
  int in_width_local;
  float **input_local;
  
  for (i = 0; i < layer_config->out_channels; i = i + 1) {
    u = 0;
    for (h = 0; h < in_height; h = layer_config->skip_height + h) {
      v = 0;
      for (w = 0; w < in_width; w = layer_config->skip_width + w) {
        hh = h;
        while( true ) {
          local_6c = in_height;
          if (h + layer_config->skip_height <= in_height) {
            local_6c = h + layer_config->skip_height;
          }
          if (local_6c <= hh) break;
          ww = w;
          while( true ) {
            local_74 = in_width;
            if (w + layer_config->skip_width <= in_width) {
              local_74 = w + layer_config->skip_width;
            }
            if (local_74 <= ww) break;
            sum = layer_config->bias[i];
            for (k = 0; k < layer_config->in_channels; k = k + 1) {
              off = k * layer_config->out_channels + i;
              for (l = 0; l < layer_config->filter_height; l = l + 1) {
                iVar1 = (hh + l) - filter_height_half;
                for (m = 0; m < layer_config->filter_width; m = m + 1) {
                  iVar2 = (ww + m) - filter_width_half;
                  if ((((-1 < iVar1) && (iVar1 < in_height)) && (-1 < iVar2)) && (iVar2 < in_width))
                  {
                    sum = layer_config->weights[off] * input[k][iVar1 * in_stride + iVar2] + sum;
                  }
                  off = cstep + off;
                }
              }
            }
            if ((h == hh) && (w == ww)) {
              output[i][u * out_stride + v] = sum;
            }
            else {
              if (output[i][u * out_stride + v] <= sum) {
                local_78 = sum;
              }
              else {
                local_78 = output[i][u * out_stride + v];
              }
              output[i][u * out_stride + v] = local_78;
            }
            ww = ww + 1;
          }
          hh = hh + 1;
        }
        v = v + 1;
      }
      u = u + 1;
    }
  }
  return;
}

Assistant:

static void convolve_maxpool_padding_zero(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *const layer_config, float **output, int out_stride,
    const int cstep, const int filter_width_half,
    const int filter_height_half) {
  for (int i = 0; i < layer_config->out_channels; ++i) {
    for (int h = 0, u = 0; h < in_height; h += layer_config->skip_height, ++u) {
      for (int w = 0, v = 0; w < in_width; w += layer_config->skip_width, ++v) {
        for (int hh = h; hh < AOMMIN(in_height, h + layer_config->skip_height);
             ++hh) {
          for (int ww = w; ww < AOMMIN(in_width, w + layer_config->skip_width);
               ++ww) {
            float sum = layer_config->bias[i];
            for (int k = 0; k < layer_config->in_channels; ++k) {
              int off = k * layer_config->out_channels + i;
              for (int l = 0; l < layer_config->filter_height; ++l) {
                const int ii = hh + l - filter_height_half;
                for (int m = 0; m < layer_config->filter_width;
                     ++m, off += cstep) {
                  const int jj = ww + m - filter_width_half;
                  if (ii < 0 || ii >= in_height || jj < 0 || jj >= in_width)
                    continue;
                  sum += layer_config->weights[off] *
                         input[k][ii * in_stride + jj];
                }
              }
            }
            const float a = sum;
            if (h == hh && w == ww)
              output[i][u * out_stride + v] = a;
            else
              output[i][u * out_stride + v] =
                  AOMMAX(output[i][u * out_stride + v], a);
          }
        }
      }
    }
  }
}